

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O3

void __thiscall
gvr::TexturedMesh::savePLY(TexturedMesh *this,char *plyname,bool all,ply_encoding enc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_01;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_02;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  void *pvVar2;
  void *__buf_08;
  void *extraout_RDX_04;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  int __fd;
  string *psVar3;
  long lVar4;
  long lVar5;
  PLYWriter ply;
  ostringstream out;
  string local_408;
  PLYWriter local_3e8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  psVar3 = &local_408;
  PLYWriter::PLYWriter(&local_3e8);
  PLYWriter::open(&local_3e8,plyname,enc);
  Model::setOriginToPLY((Model *)this,&local_3e8);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"TextureFile ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__cxx11::stringbuf::str();
  PLYWriter::addComment(&local_3e8,&local_408);
  paVar1 = &local_408.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"vertex","");
  PLYWriter::addElement(&local_3e8,&local_408,(long)(this->super_Mesh).super_PointCloud.n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"x","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"y","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"z","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
    if (!all) goto LAB_00122344;
  }
  else {
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"scan_size","");
    PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (!all) goto LAB_00122344;
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"scan_error","");
    PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"scan_conf","");
    PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
  }
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"sx","");
    PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"sy","");
    PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"sz","");
    PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"nx","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"ny","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"nz","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
LAB_00122344:
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"u","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"v","");
  PLYWriter::addProperty(&local_3e8,&local_408,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"face","");
  PLYWriter::addElement(&local_3e8,&local_408,(long)(this->super_Mesh).n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"vertex_indices","");
  __n = 6;
  PLYWriter::addProperty(&local_3e8,&local_408,ply_uint8,ply_uint32);
  pvVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p);
    pvVar2 = extraout_RDX_00;
  }
  __fd = (int)psVar3;
  if (0 < (this->super_Mesh).super_PointCloud.n) {
    lVar4 = 0;
    do {
      PLYWriter::write(&local_3e8,(int)psVar3,pvVar2,__n);
      PLYWriter::write(&local_3e8,(int)psVar3,__buf,__n);
      PLYWriter::write(&local_3e8,(int)psVar3,__buf_00,__n);
      if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
        pvVar2 = __buf_01;
        if (all) goto LAB_001224e2;
      }
      else {
        PLYWriter::write(&local_3e8,(int)psVar3,__buf_01,__n);
        pvVar2 = __buf_02;
        if (all) {
          PLYWriter::write(&local_3e8,(int)psVar3,__buf_02,__n);
          PLYWriter::write(&local_3e8,(int)psVar3,__buf_03,__n);
          pvVar2 = extraout_RDX_01;
LAB_001224e2:
          if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
            PLYWriter::write(&local_3e8,(int)psVar3,pvVar2,__n);
            PLYWriter::write(&local_3e8,(int)psVar3,__buf_04,__n);
            PLYWriter::write(&local_3e8,(int)psVar3,__buf_05,__n);
            pvVar2 = extraout_RDX_02;
          }
          PLYWriter::write(&local_3e8,(int)psVar3,pvVar2,__n);
          PLYWriter::write(&local_3e8,(int)psVar3,__buf_06,__n);
          PLYWriter::write(&local_3e8,(int)psVar3,__buf_07,__n);
          pvVar2 = extraout_RDX_03;
        }
      }
      PLYWriter::write(&local_3e8,(int)psVar3,pvVar2,__n);
      PLYWriter::write(&local_3e8,(int)psVar3,__buf_08,__n);
      __fd = (int)psVar3;
      lVar4 = lVar4 + 1;
      pvVar2 = extraout_RDX_04;
    } while (lVar4 < (this->super_Mesh).super_PointCloud.n);
  }
  if (0 < (this->super_Mesh).n) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      PLYWriter::writeListSize(&local_3e8,3);
      PLYWriter::write(&local_3e8,*(int *)((long)(this->super_Mesh).triangle + lVar5),__buf_09,__n);
      PLYWriter::write(&local_3e8,*(int *)((long)(this->super_Mesh).triangle + lVar5 + 4),__buf_10,
                       __n);
      __fd = *(int *)((long)(this->super_Mesh).triangle + lVar5 + 8);
      PLYWriter::write(&local_3e8,__fd,__buf_11,__n);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar4 < (this->super_Mesh).n);
  }
  PLYWriter::close(&local_3e8,__fd);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  PLYWriter::~PLYWriter(&local_3e8);
  return;
}

Assistant:

void TexturedMesh::savePLY(const char *plyname, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(plyname, enc);

  // define data

  setOriginToPLY(ply);

  std::ostringstream out;
  out << "TextureFile " << name;
  ply.addComment(out.str());

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addProperty("u", ply_float32);
  ply.addProperty("v", ply_float32);

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }

    ply.write(getTextureCoordComp(i, 0));
    ply.write(getTextureCoordComp(i, 1));
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}